

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotVLines<float>(char *label_id,float *xs,int count,int offset,int stride)

{
  float fVar1;
  ImPlotRange IVar2;
  undefined1 auVar3 [16];
  double dVar4;
  ulong uVar5;
  undefined1 auVar6 [12];
  ImPlotContext *pIVar7;
  bool bVar8;
  ImU32 col;
  ImDrawList *DrawList;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ImPlotRange in_XMM4;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ImPlotLimits lims;
  TransformerLinLin local_8c;
  GetterXsYRef<float> local_88;
  GetterXsYRef<float> local_68;
  ImPlotLimits local_48;
  
  bVar8 = BeginItem(label_id,0);
  if (bVar8) {
    GetPlotLimits(&local_48,-1);
    pIVar7 = GImPlot;
    local_68.YRef = local_48.Y.Min;
    if (count == 0) {
      local_88.Offset = 0;
    }
    else {
      local_88.Offset = (offset % count + count) % count;
    }
    local_88.YRef = local_48.Y.Max;
    if ((0 < count) && (GImPlot->FitThisFrame != false)) {
      iVar9 = 0;
      do {
        fVar1 = *(float *)((long)xs +
                          (long)(((local_88.Offset + iVar9) % count + count) % count) * (long)stride
                          );
        dVar4 = (double)fVar1;
        if (((long)ABS(dVar4) < 0x7ff0000000000000) &&
           ((0.0 < fVar1 || (((pIVar7->CurrentPlot->XAxis).Flags & 0x20U) == 0)))) {
          IVar2 = pIVar7->ExtentsX;
          auVar6._4_8_ = in_XMM4.Max;
          auVar6._0_4_ = IVar2.Min._4_4_;
          auVar12._0_8_ = auVar6._0_8_ << 0x20;
          auVar12._8_4_ = IVar2.Max._0_4_;
          auVar12._12_4_ = IVar2.Max._4_4_;
          uVar10 = -(ulong)(dVar4 < IVar2.Min);
          uVar11 = -(ulong)(auVar12._8_8_ < dVar4);
          uVar5 = (ulong)dVar4 & uVar11;
          auVar13._0_8_ = ~uVar10 & (ulong)IVar2.Min;
          auVar13._8_8_ = ~uVar11 & (ulong)IVar2.Max;
          auVar3._8_4_ = (int)uVar5;
          auVar3._0_8_ = (ulong)dVar4 & uVar10;
          auVar3._12_4_ = (int)(uVar5 >> 0x20);
          in_XMM4 = (ImPlotRange)(auVar13 | auVar3);
          pIVar7->ExtentsX = in_XMM4;
        }
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
    }
    local_88.Xs = xs;
    local_88.Count = count;
    local_88.Stride = stride;
    local_68.Xs = xs;
    local_68.Count = count;
    local_68.Offset = local_88.Offset;
    local_68.Stride = stride;
    DrawList = GetPlotDrawList();
    if ((pIVar7->NextItemData).RenderLine == true) {
      col = ImGui::GetColorU32((pIVar7->NextItemData).Colors);
      iVar9 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar9]) {
      case 0:
        local_8c.YAxis = iVar9;
        RenderLineSegments<ImPlot::GetterXsYRef<float>,ImPlot::GetterXsYRef<float>,ImPlot::TransformerLinLin>
                  (&local_68,&local_88,&local_8c,DrawList,(pIVar7->NextItemData).LineWeight,col);
        break;
      case 1:
        local_8c.YAxis = iVar9;
        RenderLineSegments<ImPlot::GetterXsYRef<float>,ImPlot::GetterXsYRef<float>,ImPlot::TransformerLogLin>
                  (&local_68,&local_88,(TransformerLogLin *)&local_8c,DrawList,
                   (pIVar7->NextItemData).LineWeight,col);
        break;
      case 2:
        local_8c.YAxis = iVar9;
        RenderLineSegments<ImPlot::GetterXsYRef<float>,ImPlot::GetterXsYRef<float>,ImPlot::TransformerLinLog>
                  (&local_68,&local_88,(TransformerLinLog *)&local_8c,DrawList,
                   (pIVar7->NextItemData).LineWeight,col);
        break;
      case 3:
        local_8c.YAxis = iVar9;
        RenderLineSegments<ImPlot::GetterXsYRef<float>,ImPlot::GetterXsYRef<float>,ImPlot::TransformerLogLog>
                  (&local_68,&local_88,(TransformerLogLog *)&local_8c,DrawList,
                   (pIVar7->NextItemData).LineWeight,col);
      }
    }
    pIVar7 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar7->NextItemData);
    pIVar7->PreviousItem = pIVar7->CurrentItem;
    pIVar7->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotVLines(const char* label_id, const T* xs, int count, int offset, int stride) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        const ImPlotLimits lims = GetPlotLimits();
        GetterXsYRef<T> get_min(xs,lims.Y.Min,count,offset,stride);
        GetterXsYRef<T> get_max(xs,lims.Y.Max,count,offset,stride);
        if (FitThisFrame()) {
            for (int i = 0; i < get_min.Count; ++i)
                FitPointX(get_min(i).x);
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render stems
        if (s.RenderLine) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineSegments(get_min, get_max, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineSegments(get_min, get_max, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineSegments(get_min, get_max, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineSegments(get_min, get_max, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        EndItem();
    }
}